

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O2

void __thiscall rudp::session::update_receive_head(session *this,outiter_t *received)

{
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *pvVar1;
  ulong uVar2;
  array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
  *paVar3;
  uint8_t uVar4;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *__last;
  byte *pbVar5;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *psVar6;
  uint8_t uVar7;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *iter;
  iterator iter_1;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *__first;
  array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
  *__value;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> local_68;
  uint local_4c;
  array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
  *local_48;
  uint8_t *local_40;
  session *local_38;
  
  local_40 = &this->receive_head;
  local_4c = (uint)this->receive_head;
  __first = (this->receive_buffer)._M_elems + this->receive_head;
  local_68.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_68.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __last = std::
           __find_if<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const>>
                     (__first);
  local_48 = &this->receive_buffer;
  local_38 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.
              super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  for (psVar6 = __first; psVar6 != __last; psVar6 = psVar6 + 1) {
    pvVar1 = &((psVar6->
               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->
              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
    ;
    if ((pvVar1 != (vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                    *)0x0) && (uVar2 = (pvVar1->m_holder).m_size, 2 < uVar2)) {
      pbVar5 = boost::container::
               vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
               ::operator[](pvVar1,1);
      if (*pbVar5 < uVar2) {
        std::
        back_insert_iterator<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
        ::operator=(received,psVar6);
      }
    }
  }
  local_68.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_68.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __fill_a1<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>>
            (__first,__last,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.
              super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  __value = local_48;
  uVar7 = (uint8_t)((uint)((int)__last - (int)local_48) >> 4);
  *local_40 = uVar7;
  if (__last == (shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)
                local_40) {
    local_68.
    super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_68.
    super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    psVar6 = std::
             __find_if<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const>>
                       (local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.
                super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    for (; paVar3 = local_48,
        __value !=
        (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
         *)psVar6;
        __value = (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
                   *)(__value->_M_elems + 1)) {
      pvVar1 = &(__value->_M_elems[0].
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->
                super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
      ;
      if ((pvVar1 != (vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                      *)0x0) && (uVar2 = (pvVar1->m_holder).m_size, 2 < uVar2)) {
        pbVar5 = boost::container::
                 vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                 ::operator[](pvVar1,1);
        if (*pbVar5 < uVar2) {
          std::
          back_insert_iterator<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
          ::operator=(received,__value->_M_elems);
        }
      }
    }
    local_68.
    super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_68.
    super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    __fill_a1<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>>
              (local_48->_M_elems,psVar6,&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.
                super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    uVar7 = (uint8_t)((uint)((int)psVar6 - (int)paVar3) >> 4);
    *local_40 = uVar7;
  }
  uVar4 = local_38->out_of_sequence_count + '\x01';
  if ((uint8_t)local_4c != uVar7) {
    uVar4 = '\0';
  }
  local_38->out_of_sequence_count = uVar4;
  return;
}

Assistant:

void session::update_receive_head( outiter_t &received ) {
    const auto old_receive_head = receive_head;
    const auto head_iter = std::next( receive_buffer.begin(), receive_head );
    const auto end_iter = std::find( head_iter, receive_buffer.end(), buffer_ptr_t() );
    for( auto iter = head_iter; iter != end_iter; ++iter ) {
      if( iter && *iter && (*iter)->size() > 2 && (*iter)->size() > (**iter)[ 1 ] ) {
        *received = *iter;
	       ++received;
      }
    }
    std::fill( head_iter, end_iter, buffer_ptr_t() );
    receive_head = std::distance( receive_buffer.begin(), end_iter );
    if( end_iter == receive_buffer.end() ) {
      const auto head_iter = receive_buffer.begin();
      const auto end_iter = std::find( head_iter, receive_buffer.end(), buffer_ptr_t() );
      for( auto iter = head_iter; iter != end_iter; ++iter ) {
        if( iter && *iter && (*iter)->size() > 2 && (*iter)->size() > (**iter)[ 1 ] ) {
          *received = *iter;
          ++received;
        }
      }
      std::fill( head_iter, end_iter, buffer_ptr_t() );
      receive_head = std::distance( receive_buffer.begin(), end_iter );
    }
    if( old_receive_head == receive_head ) ++out_of_sequence_count;
    else out_of_sequence_count = 0;
  }